

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O3

void __thiscall
iutest::detail::
iuConcatParamHolder<iutest::detail::iuParamGenerator<bool>,_iutest::detail::iuValueArray<int,_int>_>
::params_t<int>::append(params_t<int> *this,IParamGenerater *gen)

{
  iterator __position;
  int iVar1;
  int local_1c;
  
  (*gen->_vptr_iuIParamGenerator[2])(gen);
  while( true ) {
    iVar1 = (*gen->_vptr_iuIParamGenerator[5])(gen);
    if ((char)iVar1 != '\0') break;
    local_1c = (*gen->_vptr_iuIParamGenerator[3])(gen);
    __position._M_current =
         (this->val).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (this->val).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->val,__position,&local_1c);
    }
    else {
      *__position._M_current = local_1c;
      (this->val).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
    }
    (*gen->_vptr_iuIParamGenerator[4])(gen);
  }
  (*gen->_vptr_iuIParamGenerator[1])(gen);
  return;
}

Assistant:

void append(IParamGenerater* gen)
        {
            detail::scoped_ptr<IParamGenerater> p(gen);
            for( p->Begin(); !p->IsEnd(); p->Next() )
            {
                val.push_back(p->GetCurrent());
            }
        }